

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void desc_obj_fake(wchar_t k_idx)

{
  object_kind *kind;
  object *obj_00;
  object_kind *kind_00;
  object_kind *poVar1;
  object *obj_01;
  object *dest;
  textblock *tb;
  object *known_obj;
  object *obj;
  char header [120];
  
  poVar1 = k_info;
  kind = k_info + k_idx;
  obj_00 = player->upkeep->object;
  kind_00 = player->upkeep->object_kind;
  obj_01 = object_new();
  obj = obj_01;
  dest = object_new();
  known_obj = dest;
  track_object_kind(player->upkeep,kind);
  handle_stuff(player);
  object_prep(obj_01,kind,L'\0',EXTREMIFY);
  if ((poVar1[k_idx].aware != false) || (kind->flavor == (flavor *)0x0)) {
    object_copy(dest,obj_01);
  }
  obj_01->known = dest;
  handle_stuff(player);
  tb = object_info(obj_01,OINFO_FAKE);
  object_desc(header,0x78,obj_01,0xc0,player);
  textui_textblock_show(tb,(region)ZEXT816(0),header);
  object_delete((chunk *)0x0,(chunk *)0x0,&known_obj);
  object_delete((chunk *)0x0,(chunk *)0x0,&obj);
  textblock_free(tb);
  if (kind_00 == (object_kind *)0x0) {
    if (obj_00 == (object *)0x0) {
      track_object_cancel(player->upkeep);
    }
    else {
      track_object(player->upkeep,obj_00);
    }
  }
  else {
    track_object_kind(player->upkeep,kind_00);
  }
  return;
}

Assistant:

static void desc_obj_fake(int k_idx)
{
	struct object_kind *kind = &k_info[k_idx];
	struct object_kind *old_kind = player->upkeep->object_kind;
	struct object *old_obj = player->upkeep->object;
	struct object *obj = object_new(), *known_obj = object_new();

	char header[120];

	textblock *tb;
	region area = { 0, 0, 0, 0 };

	/* Update the object recall window */
	track_object_kind(player->upkeep, kind);
	handle_stuff(player);

	/* Create the artifact */
	object_prep(obj, kind, 0, EXTREMIFY);

	/* It's fully known */
	if (kind->aware || !kind->flavor)
		object_copy(known_obj, obj);
	obj->known = known_obj;

	/* Hack -- Handle stuff */
	handle_stuff(player);

	tb = object_info(obj, OINFO_FAKE);
	object_desc(header, sizeof(header), obj,
		ODESC_PREFIX | ODESC_CAPITAL, player);

	textui_textblock_show(tb, area, header);
	object_delete(NULL, NULL, &known_obj);
	object_delete(NULL, NULL, &obj);
	textblock_free(tb);

	/* Restore the old trackee */
	if (old_kind)
		track_object_kind(player->upkeep, old_kind);
	else if (old_obj)
		track_object(player->upkeep, old_obj);
	else
		track_object_cancel(player->upkeep);
}